

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O1

void __thiscall
OpenMD::DataStorage::internalResize<OpenMD::Vector3<double>>
          (DataStorage *this,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *v,
          size_t newSize)

{
  pointer pVVar1;
  iterator __beg;
  long lVar2;
  size_type __n;
  value_type local_18;
  
  pVVar1 = (v->
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(v->
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
  __n = newSize + (lVar2 >> 3) * 0x5555555555555555;
  if (__n != 0) {
    if (newSize < (ulong)((lVar2 >> 3) * -0x5555555555555555) || __n == 0) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::_M_erase
                (v,pVVar1 + newSize,(Vector3<double> *)(lVar2 + (long)pVVar1));
      return;
    }
    local_18.super_Vector<double,_3U>.data_[0] = 0.0;
    local_18.super_Vector<double,_3U>.data_[1] = 0.0;
    local_18.super_Vector<double,_3U>.data_[2] = 0.0;
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::_M_fill_insert
              (v,(Vector3<double> *)((long)pVVar1 + lVar2),__n,&local_18);
  }
  return;
}

Assistant:

void DataStorage::internalResize(std::vector<T>& v, std::size_t newSize) {
    std::size_t oldSize = v.size();

    if (oldSize == newSize) {
      return;
    } else if (oldSize < newSize) {
      v.insert(v.end(), newSize - oldSize, T());
    } else {
      typename std::vector<T>::iterator i;
      i = v.begin();
      std::advance(i, newSize);
      v.erase(i, v.end());
    }
  }